

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

leb_Node leb_BoundingNode_Quad(leb_Heap *leb,float x,float y)

{
  bool bVar1;
  leb_Node lVar2;
  ulong uVar3;
  leb_Node lVar4;
  leb_Node lVar5;
  float fVar6;
  float local_2c;
  float local_28;
  
  lVar5.id = 0;
  lVar5.depth = 0;
  lVar4.id = 0;
  lVar4.depth = 0;
  if ((((y <= 1.0) && (x <= 1.0)) && (0.0 <= x)) && (lVar5 = lVar4, 0.0 <= y)) {
    bVar1 = 1.0 < x + y;
    if (bVar1) {
      x = 1.0 - x;
      y = 1.0 - y;
    }
    lVar2.id = bVar1 + 2;
    lVar2.depth = 0;
    uVar3 = 1;
    local_2c = x;
    local_28 = y;
    while( true ) {
      lVar5 = (leb_Node)(((ulong)lVar2 & 0xffffffff) + (uVar3 << 0x20));
      bVar1 = leb_IsLeafNode(leb,lVar5);
      if ((bVar1) || (leb->maxDepth == (int)uVar3)) break;
      if (local_28 <= local_2c) {
        lVar2 = leb__RightChildNode(lVar5);
        fVar6 = (1.0 - local_2c) - local_28;
      }
      else {
        lVar2 = leb__LeftChildNode(lVar5);
        fVar6 = local_28 - local_2c;
        local_2c = 1.0 - local_2c;
      }
      uVar3 = (ulong)lVar2 >> 0x20;
      local_2c = local_2c - local_28;
      local_28 = fVar6;
    }
    lVar5 = (leb_Node)((ulong)lVar2 & 0xffffffff | uVar3 << 0x20);
  }
  return lVar5;
}

Assistant:

LEBDEF leb_Node leb_BoundingNode_Quad(const leb_Heap *leb, float x, float y)
{
    leb_Node node = {0u, 0};

    if (x >= 0.0f && y >= 0.0f && x <= 1.0f && y <= 1.0f) {
        if (x + y <= 1.0f) {
            node = {2u, 1};
        } else {
            node = {3u, 1};
            x = 1 - x;
            y = 1 - y;
        }

        while (!leb_IsLeafNode(leb, node) && !leb_IsCeilNode(leb, node)) {
            float s = x, t = y;

            if (s < t) {
                node = leb__LeftChildNode(node);
                x = (1.0f - s - t);
                y = (t - s);
            } else {
                node = leb__RightChildNode(node);
                x = (s - t);
                y = (1.0f - s - t);
            }
        }
    }

    return node;
}